

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O2

void __thiscall leveldb::_Test_IterMultiWithDelete::_Run(_Test_IterMultiWithDelete *this)

{
  string *v;
  DBTest *this_00;
  DB *pDVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  allocator local_21a;
  allocator local_219;
  undefined1 local_218 [72];
  Logger *local_1d0;
  char *pcStack_1c8;
  Iterator *iter;
  
  v = (string *)(local_218 + 8);
  this_00 = (DBTest *)(local_218 + 0x28);
  do {
    test::Tester::Tester
              ((Tester *)&local_1d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x3b5);
    std::__cxx11::string::string((string *)v,"a",&local_219);
    std::__cxx11::string::string((string *)this_00,"va",&local_21a);
    DBTest::Put((DBTest *)local_218,(string *)this,v);
    test::Tester::IsOk((Tester *)&local_1d0,(Status *)local_218);
    Status::~Status((Status *)local_218);
    std::__cxx11::string::~string((string *)this_00);
    std::__cxx11::string::~string((string *)v);
    test::Tester::~Tester((Tester *)&local_1d0);
    test::Tester::Tester
              ((Tester *)&local_1d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x3b6);
    std::__cxx11::string::string((string *)v,"b",&local_219);
    std::__cxx11::string::string((string *)this_00,"vb",&local_21a);
    DBTest::Put((DBTest *)local_218,(string *)this,v);
    test::Tester::IsOk((Tester *)&local_1d0,(Status *)local_218);
    Status::~Status((Status *)local_218);
    std::__cxx11::string::~string((string *)this_00);
    std::__cxx11::string::~string((string *)v);
    test::Tester::~Tester((Tester *)&local_1d0);
    test::Tester::Tester
              ((Tester *)&local_1d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x3b7);
    std::__cxx11::string::string((string *)v,"c",&local_219);
    std::__cxx11::string::string((string *)this_00,"vc",&local_21a);
    DBTest::Put((DBTest *)local_218,(string *)this,v);
    test::Tester::IsOk((Tester *)&local_1d0,(Status *)local_218);
    Status::~Status((Status *)local_218);
    std::__cxx11::string::~string((string *)this_00);
    std::__cxx11::string::~string((string *)v);
    test::Tester::~Tester((Tester *)&local_1d0);
    test::Tester::Tester
              ((Tester *)&local_1d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x3b8);
    std::__cxx11::string::string((string *)v,"b",(allocator *)local_218);
    DBTest::Delete(this_00,(string *)this);
    test::Tester::IsOk((Tester *)&local_1d0,(Status *)this_00);
    Status::~Status((Status *)this_00);
    std::__cxx11::string::~string((string *)v);
    test::Tester::~Tester((Tester *)&local_1d0);
    test::Tester::Tester
              ((Tester *)&local_1d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x3b9);
    std::__cxx11::string::string((string *)this_00,"b",(allocator *)local_218);
    DBTest::Get(v,&this->super_DBTest,(string *)this_00,(Snapshot *)0x0);
    test::Tester::IsEq<char[10],std::__cxx11::string>
              ((Tester *)&local_1d0,(char (*) [10])"NOT_FOUND",v);
    std::__cxx11::string::~string((string *)v);
    std::__cxx11::string::~string((string *)this_00);
    test::Tester::~Tester((Tester *)&local_1d0);
    pDVar1 = (this->super_DBTest).db_;
    pcStack_1c8 = (char *)0x0;
    local_1d0 = (Logger *)0x100;
    iVar3 = (*pDVar1->_vptr_DB[6])(pDVar1,(Tester *)&local_1d0);
    iter = (Iterator *)CONCAT44(extraout_var,iVar3);
    local_1d0 = (Logger *)0x1370f3;
    pcStack_1c8 = (char *)0x1;
    (*iter->_vptr_Iterator[5])(iter,(Tester *)&local_1d0);
    test::Tester::Tester
              ((Tester *)&local_1d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x3bd);
    DBTest::IterStatus_abi_cxx11_(v,&this->super_DBTest,iter);
    test::Tester::IsEq<std::__cxx11::string,char[6]>((Tester *)&local_1d0,v,(char (*) [6])"c->vc");
    std::__cxx11::string::~string((string *)v);
    test::Tester::~Tester((Tester *)&local_1d0);
    (*iter->_vptr_Iterator[7])(iter);
    test::Tester::Tester
              ((Tester *)&local_1d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
               ,0x3bf);
    DBTest::IterStatus_abi_cxx11_(v,&this->super_DBTest,iter);
    test::Tester::IsEq<std::__cxx11::string,char[6]>((Tester *)&local_1d0,v,(char (*) [6])"a->va");
    std::__cxx11::string::~string((string *)v);
    test::Tester::~Tester((Tester *)&local_1d0);
    (*iter->_vptr_Iterator[1])(iter);
    bVar2 = DBTest::ChangeOptions(&this->super_DBTest);
  } while (bVar2);
  return;
}

Assistant:

TEST(DBTest, IterMultiWithDelete) {
  do {
    ASSERT_OK(Put("a", "va"));
    ASSERT_OK(Put("b", "vb"));
    ASSERT_OK(Put("c", "vc"));
    ASSERT_OK(Delete("b"));
    ASSERT_EQ("NOT_FOUND", Get("b"));

    Iterator* iter = db_->NewIterator(ReadOptions());
    iter->Seek("c");
    ASSERT_EQ(IterStatus(iter), "c->vc");
    iter->Prev();
    ASSERT_EQ(IterStatus(iter), "a->va");
    delete iter;
  } while (ChangeOptions());
}